

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ShaderTextureFunctionCase::initShaderSources
          (ShaderTextureFunctionCase *this)

{
  Function function_00;
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  DataType dataType;
  char *pcVar6;
  char *pcVar7;
  TextureFormat format;
  char *pcVar8;
  ostream *poVar9;
  int *piVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  char *local_438;
  DataType local_424;
  DataType local_420;
  DataType local_41c;
  bool local_409;
  int local_408;
  byte local_402;
  string local_3f0 [32];
  string local_3d0 [32];
  int local_3b0;
  uint local_3ac;
  int ndx;
  int offsetComps;
  char *lodBias;
  char *gradY;
  char *gradX;
  char *texCoord;
  ostringstream *op;
  undefined1 local_370 [8];
  ostringstream frag;
  ostringstream vert;
  char *local_60;
  char *baseFuncName;
  char *gradTypeName;
  DataType gradType;
  DataType samplerType;
  TextureFormat texFmt;
  char *coordPrecName;
  char *coordTypeName;
  Precision coordPrec;
  DataType coordType;
  int extraCoordComps;
  int texCoordComps;
  bool hasLodBias;
  bool isIntCoord;
  bool is2DProj4;
  bool isShadow;
  bool isGrad;
  bool isProj;
  bool isVtxCase;
  Function function;
  ShaderTextureFunctionCase *this_local;
  
  function_00 = (this->m_lookupSpec).function;
  bVar1 = (this->super_ShaderRenderCase).m_isVertexCase & 1;
  bVar2 = anon_unknown_1::functionHasProj(function_00);
  bVar3 = anon_unknown_1::functionHasGrad(function_00);
  bVar11 = (this->m_textureSpec).sampler.compare != COMPAREMODE_NONE;
  bVar12 = false;
  if ((((!bVar11) && (bVar12 = false, (this->m_textureSpec).type == TEXTURETYPE_2D)) &&
      (bVar12 = true, function_00 != FUNCTION_TEXTUREPROJ)) &&
     (bVar12 = true, function_00 != FUNCTION_TEXTUREPROJLOD)) {
    bVar12 = function_00 == FUNCTION_TEXTUREPROJGRAD;
  }
  bVar13 = function_00 == FUNCTION_TEXELFETCH;
  bVar4 = anon_unknown_1::functionHasLod((this->m_lookupSpec).function);
  local_402 = 1;
  if (!bVar4) {
    local_402 = (this->m_lookupSpec).useBias;
  }
  local_402 = local_402 & 1;
  iVar5 = 3;
  if ((this->m_textureSpec).type == TEXTURETYPE_2D) {
    iVar5 = 2;
  }
  if (bVar2) {
    local_408 = 1;
    if (bVar12) {
      local_408 = 2;
    }
  }
  else {
    local_408 = 0;
  }
  dataType = glu::getDataTypeFloatVec(iVar5 + local_408 + (uint)bVar11);
  pcVar6 = glu::getDataTypeName(dataType);
  pcVar7 = glu::getPrecisionName(PRECISION_HIGHP);
  format = glu::mapGLInternalFormat((this->m_textureSpec).format);
  gradTypeName._4_4_ = TYPE_LAST;
  local_409 = true;
  if ((this->m_textureSpec).type != TEXTURETYPE_CUBE_MAP) {
    local_409 = (this->m_textureSpec).type == TEXTURETYPE_3D;
  }
  pcVar8 = glu::getDataTypeName(local_409 | TYPE_FLOAT_VEC2);
  local_60 = (char *)0x0;
  switch((this->m_textureSpec).type) {
  case TEXTURETYPE_2D:
    if (bVar11) {
      local_41c = TYPE_SAMPLER_2D_SHADOW;
    }
    else {
      local_41c = glu::getSampler2DType(format);
    }
    gradTypeName._4_4_ = local_41c;
    break;
  case TEXTURETYPE_CUBE_MAP:
    if (bVar11) {
      local_420 = TYPE_SAMPLER_CUBE_SHADOW;
    }
    else {
      local_420 = glu::getSamplerCubeType(format);
    }
    gradTypeName._4_4_ = local_420;
    break;
  case TEXTURETYPE_2D_ARRAY:
    if (bVar11) {
      local_424 = TYPE_SAMPLER_2D_ARRAY_SHADOW;
    }
    else {
      local_424 = glu::getSampler2DArrayType(format);
    }
    gradTypeName._4_4_ = local_424;
    break;
  case TEXTURETYPE_3D:
    gradTypeName._4_4_ = glu::getSampler3DType(format);
  }
  switch((this->m_lookupSpec).function) {
  case FUNCTION_TEXTURE:
    local_60 = "texture";
    break;
  case FUNCTION_TEXTUREPROJ:
    local_60 = "textureProj";
    break;
  case FUNCTION_TEXTUREPROJ3:
    local_60 = "textureProj";
    break;
  case FUNCTION_TEXTURELOD:
    local_60 = "textureLod";
    break;
  case FUNCTION_TEXTUREPROJLOD:
    local_60 = "textureProjLod";
    break;
  case FUNCTION_TEXTUREPROJLOD3:
    local_60 = "textureProjLod";
    break;
  case FUNCTION_TEXTUREGRAD:
    local_60 = "textureGrad";
    break;
  case FUNCTION_TEXTUREPROJGRAD:
    local_60 = "textureProjGrad";
    break;
  case FUNCTION_TEXTUREPROJGRAD3:
    local_60 = "textureProjGrad";
    break;
  case FUNCTION_TEXELFETCH:
    local_60 = "texelFetch";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_370);
  if (bVar1 == 0) {
    local_438 = local_370;
  }
  else {
    local_438 = &frag.field_0x170;
  }
  texCoord = local_438;
  poVar9 = std::operator<<((ostream *)&frag.field_0x170,"#version 300 es\n");
  poVar9 = std::operator<<(poVar9,"in highp vec4 a_position;\n");
  poVar9 = std::operator<<(poVar9,"in ");
  poVar9 = std::operator<<(poVar9,pcVar7);
  poVar9 = std::operator<<(poVar9," ");
  poVar9 = std::operator<<(poVar9,pcVar6);
  std::operator<<(poVar9," a_in0;\n");
  if (bVar3) {
    poVar9 = std::operator<<((ostream *)&frag.field_0x170,"in ");
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,pcVar8);
    std::operator<<(poVar9," a_in1;\n");
    poVar9 = std::operator<<((ostream *)&frag.field_0x170,"in ");
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,pcVar8);
    std::operator<<(poVar9," a_in2;\n");
  }
  else if (local_402 != 0) {
    poVar9 = std::operator<<((ostream *)&frag.field_0x170,"in ");
    poVar9 = std::operator<<(poVar9,pcVar7);
    std::operator<<(poVar9," float a_in1;\n");
  }
  poVar9 = std::operator<<((ostream *)local_370,"#version 300 es\n");
  std::operator<<(poVar9,"layout(location = 0) out mediump vec4 o_color;\n");
  if (bVar1 == 0) {
    poVar9 = std::operator<<((ostream *)&frag.field_0x170,"out ");
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,pcVar6);
    std::operator<<(poVar9," v_texCoord;\n");
    poVar9 = std::operator<<((ostream *)local_370,"in ");
    poVar9 = std::operator<<(poVar9,pcVar7);
    poVar9 = std::operator<<(poVar9," ");
    poVar9 = std::operator<<(poVar9,pcVar6);
    std::operator<<(poVar9," v_texCoord;\n");
    if (bVar3) {
      poVar9 = std::operator<<((ostream *)&frag.field_0x170,"out ");
      poVar9 = std::operator<<(poVar9,pcVar7);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8);
      std::operator<<(poVar9," v_gradX;\n");
      poVar9 = std::operator<<((ostream *)&frag.field_0x170,"out ");
      poVar9 = std::operator<<(poVar9,pcVar7);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8);
      std::operator<<(poVar9," v_gradY;\n");
      poVar9 = std::operator<<((ostream *)local_370,"in ");
      poVar9 = std::operator<<(poVar9,pcVar7);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8);
      std::operator<<(poVar9," v_gradX;\n");
      poVar9 = std::operator<<((ostream *)local_370,"in ");
      poVar9 = std::operator<<(poVar9,pcVar7);
      poVar9 = std::operator<<(poVar9," ");
      poVar9 = std::operator<<(poVar9,pcVar8);
      std::operator<<(poVar9," v_gradY;\n");
    }
    if (local_402 != 0) {
      poVar9 = std::operator<<((ostream *)&frag.field_0x170,"out ");
      poVar9 = std::operator<<(poVar9,pcVar7);
      std::operator<<(poVar9," float v_lodBias;\n");
      poVar9 = std::operator<<((ostream *)local_370,"in ");
      poVar9 = std::operator<<(poVar9,pcVar7);
      std::operator<<(poVar9," float v_lodBias;\n");
    }
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_370,"in mediump vec4 v_color;\n");
  }
  poVar9 = std::operator<<((ostream *)texCoord,"uniform highp ");
  pcVar6 = glu::getDataTypeName(gradTypeName._4_4_);
  poVar9 = std::operator<<(poVar9,pcVar6);
  poVar9 = std::operator<<(poVar9," u_sampler;\n");
  poVar9 = std::operator<<(poVar9,"uniform highp vec4 u_scale;\n");
  std::operator<<(poVar9,"uniform highp vec4 u_bias;\n");
  poVar9 = std::operator<<((ostream *)&frag.field_0x170,"\nvoid main()\n{\n");
  std::operator<<(poVar9,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_370,"\nvoid main()\n{\n");
  if (bVar1 == 0) {
    std::operator<<((ostream *)local_370,"\to_color = ");
  }
  else {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_color = ");
  }
  gradX = "v_texCoord";
  if (bVar1 != 0) {
    gradX = "a_in0";
  }
  gradY = "v_gradX";
  if (bVar1 != 0) {
    gradY = "a_in1";
  }
  lodBias = "v_gradY";
  if (bVar1 != 0) {
    lodBias = "a_in2";
  }
  _ndx = "v_lodBias";
  if (bVar1 != 0) {
    _ndx = "a_in1";
  }
  poVar9 = std::operator<<((ostream *)texCoord,"vec4(");
  std::operator<<(poVar9,local_60);
  if (((this->m_lookupSpec).useOffset & 1U) != 0) {
    std::operator<<((ostream *)texCoord,"Offset");
  }
  std::operator<<((ostream *)texCoord,"(u_sampler, ");
  if (bVar13) {
    poVar9 = std::operator<<((ostream *)texCoord,"ivec");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar5 + local_408 + (uint)bVar11);
    std::operator<<(poVar9,"(");
  }
  std::operator<<((ostream *)texCoord,gradX);
  if (bVar13) {
    std::operator<<((ostream *)texCoord,")");
  }
  if (bVar3) {
    poVar9 = std::operator<<((ostream *)texCoord,", ");
    poVar9 = std::operator<<(poVar9,gradY);
    poVar9 = std::operator<<(poVar9,", ");
    std::operator<<(poVar9,lodBias);
  }
  bVar12 = anon_unknown_1::functionHasLod(function_00);
  if (bVar12) {
    if (bVar13) {
      poVar9 = std::operator<<((ostream *)texCoord,", int(");
      poVar9 = std::operator<<(poVar9,_ndx);
      std::operator<<(poVar9,")");
    }
    else {
      poVar9 = std::operator<<((ostream *)texCoord,", ");
      std::operator<<(poVar9,_ndx);
    }
  }
  if (((this->m_lookupSpec).useOffset & 1U) != 0) {
    local_3ac = (this->m_textureSpec).type == TEXTURETYPE_3D | 2;
    poVar9 = std::operator<<((ostream *)texCoord,", ivec");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,local_3ac);
    std::operator<<(poVar9,"(");
    for (local_3b0 = 0; local_3b0 < (int)local_3ac; local_3b0 = local_3b0 + 1) {
      if (local_3b0 != 0) {
        std::operator<<((ostream *)texCoord,", ");
      }
      pcVar6 = texCoord;
      piVar10 = tcu::Vector<int,_3>::operator[](&(this->m_lookupSpec).offset,local_3b0);
      std::ostream::operator<<(pcVar6,*piVar10);
    }
    std::operator<<((ostream *)texCoord,")");
  }
  if (((this->m_lookupSpec).useBias & 1U) != 0) {
    poVar9 = std::operator<<((ostream *)texCoord,", ");
    std::operator<<(poVar9,_ndx);
  }
  std::operator<<((ostream *)texCoord,")");
  if (bVar11) {
    std::operator<<((ostream *)texCoord,", 0.0, 0.0, 1.0)");
  }
  else {
    std::operator<<((ostream *)texCoord,")*u_scale + u_bias");
  }
  std::operator<<((ostream *)texCoord,";\n");
  if (bVar1 == 0) {
    std::operator<<((ostream *)&frag.field_0x170,"\tv_texCoord = a_in0;\n");
    if (bVar3) {
      std::operator<<((ostream *)&frag.field_0x170,"\tv_gradX = a_in1;\n");
      std::operator<<((ostream *)&frag.field_0x170,"\tv_gradY = a_in2;\n");
    }
    else if (local_402 != 0) {
      std::operator<<((ostream *)&frag.field_0x170,"\tv_lodBias = a_in1;\n");
    }
  }
  else {
    std::operator<<((ostream *)local_370,"\to_color = v_color;\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)local_370,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_3d0);
  std::__cxx11::string::~string(local_3d0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_3f0);
  std::__cxx11::string::~string(local_3f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_370);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  return;
}

Assistant:

void ShaderTextureFunctionCase::initShaderSources (void)
{
	Function			function			= m_lookupSpec.function;
	bool				isVtxCase			= m_isVertexCase;
	bool				isProj				= functionHasProj(function);
	bool				isGrad				= functionHasGrad(function);
	bool				isShadow			= m_textureSpec.sampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	bool				is2DProj4			= !isShadow && m_textureSpec.type == TEXTURETYPE_2D && (function == FUNCTION_TEXTUREPROJ || function == FUNCTION_TEXTUREPROJLOD || function == FUNCTION_TEXTUREPROJGRAD);
	bool				isIntCoord			= function == FUNCTION_TEXELFETCH;
	bool				hasLodBias			= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	int					texCoordComps		= m_textureSpec.type == TEXTURETYPE_2D ? 2 : 3;
	int					extraCoordComps		= (isProj ? (is2DProj4 ? 2 : 1) : 0) + (isShadow ? 1 : 0);
	glu::DataType		coordType			= glu::getDataTypeFloatVec(texCoordComps+extraCoordComps);
	glu::Precision		coordPrec			= glu::PRECISION_HIGHP;
	const char*			coordTypeName		= glu::getDataTypeName(coordType);
	const char*			coordPrecName		= glu::getPrecisionName(coordPrec);
	tcu::TextureFormat	texFmt				= glu::mapGLInternalFormat(m_textureSpec.format);
	glu::DataType		samplerType			= glu::TYPE_LAST;
	glu::DataType		gradType			= (m_textureSpec.type == TEXTURETYPE_CUBE_MAP || m_textureSpec.type == TEXTURETYPE_3D) ? glu::TYPE_FLOAT_VEC3 : glu::TYPE_FLOAT_VEC2;
	const char*			gradTypeName		= glu::getDataTypeName(gradType);
	const char*			baseFuncName		= DE_NULL;

	DE_ASSERT(!isGrad || !hasLodBias);

	switch (m_textureSpec.type)
	{
		case TEXTURETYPE_2D:		samplerType = isShadow ? glu::TYPE_SAMPLER_2D_SHADOW		: glu::getSampler2DType(texFmt);		break;
		case TEXTURETYPE_CUBE_MAP:	samplerType = isShadow ? glu::TYPE_SAMPLER_CUBE_SHADOW		: glu::getSamplerCubeType(texFmt);		break;
		case TEXTURETYPE_2D_ARRAY:	samplerType = isShadow ? glu::TYPE_SAMPLER_2D_ARRAY_SHADOW	: glu::getSampler2DArrayType(texFmt);	break;
		case TEXTURETYPE_3D:		DE_ASSERT(!isShadow); samplerType = glu::getSampler3DType(texFmt);									break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (m_lookupSpec.function)
	{
		case FUNCTION_TEXTURE:			baseFuncName = "texture";			break;
		case FUNCTION_TEXTUREPROJ:		baseFuncName = "textureProj";		break;
		case FUNCTION_TEXTUREPROJ3:		baseFuncName = "textureProj";		break;
		case FUNCTION_TEXTURELOD:		baseFuncName = "textureLod";		break;
		case FUNCTION_TEXTUREPROJLOD:	baseFuncName = "textureProjLod";	break;
		case FUNCTION_TEXTUREPROJLOD3:	baseFuncName = "textureProjLod";	break;
		case FUNCTION_TEXTUREGRAD:		baseFuncName = "textureGrad";		break;
		case FUNCTION_TEXTUREPROJGRAD:	baseFuncName = "textureProjGrad";	break;
		case FUNCTION_TEXTUREPROJGRAD3:	baseFuncName = "textureProjGrad";	break;
		case FUNCTION_TEXELFETCH:		baseFuncName = "texelFetch";		break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	std::ostringstream	vert;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVtxCase ? vert : frag;

	vert << "#version 300 es\n"
		 << "in highp vec4 a_position;\n"
		 << "in " << coordPrecName << " " << coordTypeName << " a_in0;\n";

	if (isGrad)
	{
		vert << "in " << coordPrecName << " " << gradTypeName << " a_in1;\n";
		vert << "in " << coordPrecName << " " << gradTypeName << " a_in2;\n";
	}
	else if (hasLodBias)
		vert << "in " << coordPrecName << " float a_in1;\n";

	frag << "#version 300 es\n"
		 << "layout(location = 0) out mediump vec4 o_color;\n";

	if (isVtxCase)
	{
		vert << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vert << "out " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";
		frag << "in " << coordPrecName << " " << coordTypeName << " v_texCoord;\n";

		if (isGrad)
		{
			vert << "out " << coordPrecName << " " << gradTypeName << " v_gradX;\n";
			vert << "out " << coordPrecName << " " << gradTypeName << " v_gradY;\n";
			frag << "in " << coordPrecName << " " << gradTypeName << " v_gradX;\n";
			frag << "in " << coordPrecName << " " << gradTypeName << " v_gradY;\n";
		}

		if (hasLodBias)
		{
			vert << "out " << coordPrecName << " float v_lodBias;\n";
			frag << "in " << coordPrecName << " float v_lodBias;\n";
		}
	}

	// Uniforms
	op << "uniform highp " << glu::getDataTypeName(samplerType) << " u_sampler;\n"
	   << "uniform highp vec4 u_scale;\n"
	   << "uniform highp vec4 u_bias;\n";

	vert << "\nvoid main()\n{\n"
		 << "\tgl_Position = a_position;\n";
	frag << "\nvoid main()\n{\n";

	if (isVtxCase)
		vert << "\tv_color = ";
	else
		frag << "\to_color = ";

	// Op.
	{
		const char*	texCoord	= isVtxCase ? "a_in0" : "v_texCoord";
		const char* gradX		= isVtxCase ? "a_in1" : "v_gradX";
		const char* gradY		= isVtxCase ? "a_in2" : "v_gradY";
		const char*	lodBias		= isVtxCase ? "a_in1" : "v_lodBias";

		op << "vec4(" << baseFuncName;
		if (m_lookupSpec.useOffset)
			op << "Offset";
		op << "(u_sampler, ";

		if (isIntCoord)
			op << "ivec" << (texCoordComps+extraCoordComps) << "(";

		op << texCoord;

		if (isIntCoord)
			op << ")";

		if (isGrad)
			op << ", " << gradX << ", " << gradY;

		if (functionHasLod(function))
		{
			if (isIntCoord)
				op << ", int(" << lodBias << ")";
			else
				op << ", " << lodBias;
		}

		if (m_lookupSpec.useOffset)
		{
			int offsetComps = m_textureSpec.type == TEXTURETYPE_3D ? 3 : 2;

			op << ", ivec" << offsetComps << "(";
			for (int ndx = 0; ndx < offsetComps; ndx++)
			{
				if (ndx != 0)
					op << ", ";
				op << m_lookupSpec.offset[ndx];
			}
			op << ")";
		}

		if (m_lookupSpec.useBias)
			op << ", " << lodBias;

		op << ")";

		if (isShadow)
			op << ", 0.0, 0.0, 1.0)";
		else
			op << ")*u_scale + u_bias";

		op << ";\n";
	}

	if (isVtxCase)
		frag << "\to_color = v_color;\n";
	else
	{
		vert << "\tv_texCoord = a_in0;\n";

		if (isGrad)
		{
			vert << "\tv_gradX = a_in1;\n";
			vert << "\tv_gradY = a_in2;\n";
		}
		else if (hasLodBias)
			vert << "\tv_lodBias = a_in1;\n";
	}

	vert << "}\n";
	frag << "}\n";

	m_vertShaderSource = vert.str();
	m_fragShaderSource = frag.str();
}